

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

bool __thiscall indk::Event::doWaitTimed(Event *this,int T)

{
  cv_status cVar1;
  long lVar2;
  char cVar3;
  unique_lock<std::mutex> oNotifierLock;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  local_48._M_owns = false;
  local_48._M_device = &this->m_oMutex;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  cVar3 = '\x01';
  if (this->m_bEvent == false) {
    do {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(lVar2 + (long)T * 1000000);
      cVar1 = std::condition_variable::
              __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->m_oConditionVariable,&local_48,&local_38);
      cVar3 = this->m_bEvent;
      if (cVar1 == timeout) break;
    } while ((bool)cVar3 == false);
  }
  this->m_bEvent = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return (bool)cVar3;
}

Assistant:

bool indk::Event::doWaitTimed(int T) {
    auto rTimeout = std::chrono::milliseconds(T);
    bool bTimeout = false;
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    while (!m_bEvent && !bTimeout) {
        bTimeout = std::cv_status::timeout == m_oConditionVariable.wait_for(oNotifierLock, rTimeout);
    }
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}